

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O0

void deqp::gls::anon_unknown_1::genIndices
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *indices,int triangleCount)

{
  value_type_conflict3 local_1e;
  value_type_conflict3 local_1c;
  value_type_conflict3 local_1a;
  int local_18;
  int local_14;
  int triangleNdx;
  int triangleCount_local;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *indices_local;
  
  local_14 = triangleCount;
  _triangleNdx = indices;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
            (indices,(long)(triangleCount * 3));
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    local_1a = (short)local_18 * 3;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(_triangleNdx,&local_1a);
    local_1c = (short)local_18 * 3 + 1;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(_triangleNdx,&local_1c);
    local_1e = (short)local_18 * 3 + 2;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(_triangleNdx,&local_1e);
  }
  return;
}

Assistant:

void genIndices (vector<GLushort>& indices, int triangleCount)
{
	indices.reserve(triangleCount*3);

	for (int triangleNdx = 0; triangleNdx < triangleCount; triangleNdx++)
	{
		indices.push_back((GLushort)(triangleNdx*3));
		indices.push_back((GLushort)(triangleNdx*3+1));
		indices.push_back((GLushort)(triangleNdx*3+2));
	}
}